

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

bool_t ExprSkipAfter(tchar_t **p,wchar_t ch)

{
  bool_t bVar1;
  char *local_28;
  tchar_t *s;
  wchar_t ch_local;
  tchar_t **p_local;
  
  local_28 = *p;
  while( true ) {
    if (*local_28 == '\0') {
      *p = local_28;
      return 0;
    }
    if (((ch != L'\0') && (*local_28 == ch)) ||
       ((ch == L'\0' && (bVar1 = IsSpace((int)*local_28), bVar1 != 0)))) break;
    local_28 = local_28 + 1;
  }
  *p = local_28 + 1;
  if (ch == L'\0') {
    ExprSkipSpace(p);
  }
  return 1;
}

Assistant:

NOINLINE bool_t ExprSkipAfter(const tchar_t** p,int ch)
{
    const tchar_t* s = *p;
    for (;*s;++s)
        if ((ch && *s == ch) || (!ch && IsSpace(*s)))
        {
            *p = s+1;
            if (!ch) ExprSkipSpace(p); // skip other spaces too
            return 1;
        }

    *p = s;
    return 0;
}